

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

int has_available_input_device(cubeb *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  cubeb_device_collection devices;
  
  iVar2 = cubeb_enumerate_devices(ctx,CUBEB_DEVICE_TYPE_INPUT,&devices);
  if (iVar2 == 0) {
    if (devices.count != 0) {
      bVar1 = false;
      for (uVar3 = 0; uVar3 < devices.count; uVar3 = uVar3 + 1) {
        bVar1 = (bool)(bVar1 | devices.device[uVar3].state == CUBEB_DEVICE_STATE_ENABLED);
      }
      if (!bVar1) {
        fwrite("there are input devices, but they are not available, skipping\n",0x3e,1,_stderr);
      }
      cubeb_device_collection_destroy(ctx,&devices);
      return (uint)bVar1;
    }
    fwrite("no input device available, skipping test.\n",0x2a,1,_stderr);
    cubeb_device_collection_destroy(ctx,&devices);
  }
  else {
    fwrite("error enumerating devices.",0x1a,1,_stderr);
  }
  return 0;
}

Assistant:

int has_available_input_device(cubeb * ctx)
{
  cubeb_device_collection devices;
  int input_device_available = 0;
  int r;
  /* Bail out early if the host does not have input devices. */
  r = cubeb_enumerate_devices(ctx, CUBEB_DEVICE_TYPE_INPUT, &devices);
  if (r != CUBEB_OK) {
    fprintf(stderr, "error enumerating devices.");
    return 0;
  }

  if (devices.count == 0) {
    fprintf(stderr, "no input device available, skipping test.\n");
    cubeb_device_collection_destroy(ctx, &devices);
    return 0;
  }

  for (uint32_t i = 0; i < devices.count; i++) {
    input_device_available |= (devices.device[i].state ==
                               CUBEB_DEVICE_STATE_ENABLED);
  }

  if (!input_device_available) {
    fprintf(stderr, "there are input devices, but they are not "
        "available, skipping\n");
  }

  cubeb_device_collection_destroy(ctx, &devices);
  return !!input_device_available;
}